

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

ucs4_t * utf8_to_ucs4(char *utf8,size_t length)

{
  byte bVar1;
  int *__ptr;
  ucs4_t *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  
  uVar11 = 0;
  uVar5 = -(ulong)(length == 0) | length;
  do {
    if (utf8[uVar11] == '\0') {
      __ptr = (int *)malloc(0x1000);
      piVar13 = __ptr;
      if (uVar11 != 0) goto LAB_00103d90;
      goto LAB_00103f65;
    }
    uVar11 = uVar11 + 1;
  } while (uVar5 != uVar11);
  __ptr = (int *)malloc(0x1000);
  uVar11 = uVar5;
LAB_00103d90:
  lVar9 = 0x400;
  uVar5 = 0;
  piVar13 = __ptr;
  do {
    bVar1 = utf8[uVar5];
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      if ((uVar8 & 0x20) == 0) {
        uVar6 = uVar5 + 1;
        if (uVar11 <= uVar6) goto LAB_00103f7e;
        uVar3 = (uVar8 & 3) << 6 | (byte)utf8[uVar6] & 0x3f;
        uVar4 = uVar8 >> 2 & 7;
        goto LAB_00103e2e;
      }
      if ((bVar1 & 0x10) == 0) {
        uVar6 = uVar5 + 2;
        if (uVar11 <= uVar6) goto LAB_00103f7e;
        uVar3 = ((int)utf8[uVar5 + 1] & 3U) << 6 | (byte)utf8[uVar5 + 2] & 0x3f;
        uVar4 = (uVar8 & 0xf) << 4 | (uint)(int)utf8[uVar5 + 1] >> 2 & 0xf;
        goto LAB_00103e2e;
      }
      if ((bVar1 & 8) == 0) {
        uVar6 = uVar5 + 3;
        if (uVar11 <= uVar6) goto LAB_00103f7e;
        uVar3 = ((int)utf8[uVar5 + 2] & 3U) << 6 | (byte)utf8[uVar5 + 3] & 0x3f;
        uVar4 = ((int)utf8[uVar5 + 1] & 0xfU) << 4 | (uint)(int)utf8[uVar5 + 2] >> 2 & 0xf;
        uVar10 = ((uint)(int)utf8[uVar5 + 1] >> 4 & 3) + (uVar8 & 7) * 4;
        goto LAB_00103e31;
      }
      if (((bVar1 & 4) != 0) || (uVar6 = uVar5 + 4, uVar11 <= uVar6)) {
LAB_00103f7e:
        free(__ptr);
        return (ucs4_t *)0xffffffffffffffff;
      }
      uVar3 = ((int)utf8[uVar5 + 3] & 3U) << 6 | (byte)utf8[uVar5 + 4] & 0x3f;
      uVar4 = ((int)utf8[uVar5 + 2] & 0xfU) << 4 | (uint)(int)utf8[uVar5 + 3] >> 2 & 0xf;
      uVar10 = (uint)(byte)(utf8[uVar5 + 1] << 2) | (uint)(int)utf8[uVar5 + 2] >> 4 & 3;
      iVar7 = (uVar8 & 3) << 0x18;
    }
    else {
      uVar4 = 0;
      uVar6 = uVar5;
      uVar3 = uVar8;
LAB_00103e2e:
      uVar10 = 0;
LAB_00103e31:
      iVar7 = 0;
    }
    if (lVar9 == 0) {
      lVar12 = (long)piVar13 - (long)__ptr;
      lVar9 = lVar12 >> 2;
      __ptr = (int *)realloc(__ptr,lVar12 * 2);
      piVar13 = (int *)(lVar12 + (long)__ptr);
    }
    *piVar13 = uVar4 * 0x100 + uVar10 * 0x10000 + iVar7 + uVar3;
    piVar13 = piVar13 + 1;
    lVar9 = lVar9 + -1;
    uVar5 = uVar6 + 1;
    if (uVar11 <= uVar5) {
LAB_00103f65:
      puVar2 = (ucs4_t *)realloc(__ptr,((long)piVar13 - (long)__ptr) + 4);
      *(undefined4 *)((long)puVar2 + ((long)piVar13 - (long)__ptr)) = 0;
      return puVar2;
    }
  } while( true );
}

Assistant:

ucs4_t * utf8_to_ucs4(const char * utf8, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && utf8[i] != '\0'; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	ucs4_t * ucs4 = (ucs4_t *) malloc(sizeof(ucs4_t) * freesize);
	ucs4_t * pucs4 = ucs4;

	for (i = 0; i < length; i ++)
	{
		ucs4_t byte[4] = {0};
		if (GET_BIT(utf8[i], 7) == 0)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			byte[0] = utf8[i] & BITMASK(7);
		}
		else if (GET_BIT(utf8[i], 5) == 0)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			if (i + 1 >= length)
				goto err;

			byte[0] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(2)) << 6);
			byte[1] = (utf8[i] >> 2) & BITMASK(3);

			i += 1;
		}
		else if (GET_BIT(utf8[i], 4) == 0)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			if (i + 2 >= length)
				goto err;

			byte[0] = (utf8[i + 2] & BITMASK(6)) +
					((utf8[i + 1] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 1] >> 2) & BITMASK(4))
					+ ((utf8[i] & BITMASK(4)) << 4);

			i += 2;
		}
		else if (GET_BIT(utf8[i], 3) == 0)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 3 >= length)
				goto err;

			byte[0] = (utf8[i + 3] & BITMASK(6)) +
					((utf8[i + 2] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 2] >> 2) & BITMASK(4)) +
					((utf8[i + 1] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 1] >> 4) & BITMASK(2)) +
					((utf8[i] & BITMASK(3)) << 2);

			i += 3;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 4 >= length)
				goto err;

			byte[0] = (utf8[i + 4] & BITMASK(6)) +
					((utf8[i + 3] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 3] >> 2) & BITMASK(4)) +
					((utf8[i + 2] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 2] >> 4) & BITMASK(2)) +
					((utf8[i + 1] & BITMASK(6)) << 2);
			byte[3] = utf8[i] & BITMASK(2);
			i += 4;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 5 >= length)
				goto err;

			byte[0] = (utf8[i + 5] & BITMASK(6)) +
					((utf8[i + 4] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 4] >> 2) & BITMASK(4)) +
					((utf8[i + 3] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 3] >> 4) & BITMASK(2)) +
					((utf8[i + 2] & BITMASK(6)) << 2);
			byte[3] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(1)) << 6);
			i += 5;
		}
		else
			goto err;

		if (freesize == 0)
		{
			freesize = pucs4 - ucs4;
			ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * (freesize + freesize));
			pucs4 = ucs4 + freesize;
		}

		*pucs4 = (byte[3] << 24) + (byte[2] << 16) + (byte[1] << 8) + byte[0];

		pucs4 ++;
		freesize --;
	}

	length = (pucs4 - ucs4 + 1);
	ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * length);
	ucs4[length - 1] = 0;
	return ucs4;

err:
	free(ucs4);
	return (ucs4_t *) -1;
}